

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O2

void __thiscall markdown::Document::Document(Document *this,size_t spacesPerTab)

{
  Container *this_00;
  LinkIds *this_01;
  _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
  local_38;
  
  this->cSpacesPerTab = spacesPerTab;
  this_00 = (Container *)operator_new(0x28);
  local_38._M_impl._M_node._M_size = 0;
  local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_38;
  token::Container::Container(this_00,(TokenGroup *)&local_38);
  boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
            (&this->mTokenContainer,this_00);
  std::__cxx11::
  _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
  ::_M_clear(&local_38);
  this_01 = (LinkIds *)operator_new(0x30);
  boost::unordered::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>_>
                   *)this_01);
  this->mIdTable = this_01;
  this->mProcessed = false;
  return;
}

Assistant:

Document::Document(size_t spacesPerTab): cSpacesPerTab(spacesPerTab),
	mTokenContainer(new token::Container), mIdTable(new LinkIds),
	mProcessed(false)
{
	// This space deliberately blank ;-)
}